

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FKeySection,_FKeySection>::Reserve(TArray<FKeySection,_FKeySection> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FKeySection *pFVar3;
  ulong uVar4;
  ulong uVar5;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar5 = (ulong)uVar2;
  this->Count = amount + uVar2;
  if (uVar2 < amount + uVar2) {
    uVar4 = uVar5 << 5 | 0x10;
    do {
      pFVar3 = this->Array;
      *(undefined8 *)((long)pFVar3 + (uVar4 - 0x10)) = 0x8a502c;
      *(undefined8 *)((long)pFVar3 + (uVar4 - 8)) = 0x8a502c;
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      puVar1 = (undefined8 *)((long)&(pFVar3->mTitle).Chars + uVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 0x20;
    } while (uVar5 < this->Count);
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}